

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exception.hpp
# Opt level: O0

void __thiscall jsoncons::not_an_object::~not_an_object(not_an_object *this,void **vtt)

{
  undefined8 *in_RSI;
  runtime_error *in_RDI;
  
  *(undefined8 *)in_RDI = *in_RSI;
  *(undefined8 *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)) = in_RSI[1];
  std::__cxx11::string::~string((string *)(in_RDI + 0x30));
  std::__cxx11::string::~string((string *)(in_RDI + 0x10));
  std::runtime_error::~runtime_error(in_RDI);
  return;
}

Assistant:

const char* what() const noexcept override
        {
            if (what_.empty())
            {
                JSONCONS_TRY
                {
                    what_.append(std::runtime_error::what());
                    what_.append(": '");
                    what_.append(name_);
                    what_.append("'");
                    return what_.c_str();
                }
                JSONCONS_CATCH(...)
                {
                    return std::runtime_error::what();
                }
            }